

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O3

void __thiscall
glslang::TParseVersions::ppRequireExtensions
          (TParseVersions *this,TSourceLoc *loc,int numExtensions,char **extensions,
          char *featureDesc)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = (*this->_vptr_TParseVersions[0xc])();
  if ((char)iVar1 == '\0') {
    if (numExtensions == 1) {
      (*this->_vptr_TParseVersions[0x2f])
                (this,loc,"required extension not requested:",featureDesc,*extensions,
                 this->_vptr_TParseVersions[0x2f]);
      return;
    }
    (*this->_vptr_TParseVersions[0x2f])
              (this,loc,"required extension not requested:",featureDesc,
               "Possible extensions include:");
    if (0 < numExtensions) {
      uVar2 = 0;
      do {
        TInfoSinkBase::message(&this->infoSink->info,EPrefixNone,extensions[uVar2]);
        uVar2 = uVar2 + 1;
      } while ((uint)numExtensions != uVar2);
    }
  }
  return;
}

Assistant:

void TParseVersions::ppRequireExtensions(const TSourceLoc& loc, int numExtensions, const char* const extensions[],
    const char* featureDesc)
{
    if (checkExtensionsRequested(loc, numExtensions, extensions, featureDesc))
        return;

    // If we get this far, give errors explaining what extensions are needed
    if (numExtensions == 1)
        ppError(loc, "required extension not requested:", featureDesc, extensions[0]);
    else {
        ppError(loc, "required extension not requested:", featureDesc, "Possible extensions include:");
        for (int i = 0; i < numExtensions; ++i)
            infoSink.info.message(EPrefixNone, extensions[i]);
    }
}